

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

uint32_t svb_select_scalar_d1_init
                   (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,int slot)

{
  uint32_t uVar1;
  uint32_t in_ECX;
  byte *in_RDI;
  int in_R8D;
  int c;
  uint32_t key;
  uint8_t shift;
  int local_2c;
  uint local_28;
  byte local_21;
  uint32_t local_1c;
  uint8_t *local_10;
  byte *local_8;
  
  local_21 = 0;
  local_8 = in_RDI + 1;
  local_28 = (uint)*in_RDI;
  local_1c = in_ECX;
  for (local_2c = 0; local_2c <= in_R8D; local_2c = local_2c + 1) {
    if (local_21 == 8) {
      local_21 = 0;
      local_28 = (uint)*local_8;
      local_8 = local_8 + 1;
    }
    uVar1 = _decode_data(&local_10,(byte)(local_28 >> (local_21 & 0x1f)) & 3);
    local_1c = uVar1 + local_1c;
    local_21 = local_21 + 2;
  }
  return local_1c;
}

Assistant:

uint32_t svb_select_scalar_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                   uint64_t count, uint32_t prev, int slot) {
  uint8_t shift = 0;
  uint32_t key = *keyPtr++;

  (void)count;

  // make sure that the loop is run at least once
  for (int c = 0; c <= slot; c++) {
    if (shift == 8) {
      shift = 0;
      key = *keyPtr++;
    }
    prev += _decode_data(&dataPtr, (key >> shift) & 0x3);
    shift += 2;
  }

  return prev;
}